

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iteration_proxy.hpp
# Opt level: O1

void nlohmann::detail::int_to_string<std::__cxx11::string>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *target,
               size_t value)

{
  bool bVar1;
  char cVar2;
  size_t sVar3;
  char cVar4;
  string __str;
  long *local_40;
  uint local_38;
  long local_30 [2];
  
  cVar4 = '\x01';
  if (9 < value) {
    sVar3 = value;
    cVar2 = '\x04';
    do {
      cVar4 = cVar2;
      if (sVar3 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_001166ee;
      }
      if (sVar3 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_001166ee;
      }
      if (sVar3 < 10000) goto LAB_001166ee;
      bVar1 = 99999 < sVar3;
      sVar3 = sVar3 / 10000;
      cVar2 = cVar4 + '\x04';
    } while (bVar1);
    cVar4 = cVar4 + '\x01';
  }
LAB_001166ee:
  local_40 = local_30;
  std::__cxx11::string::_M_construct((ulong)&local_40,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_40,local_38,value);
  std::__cxx11::string::operator=((string *)target,(string *)&local_40);
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return;
}

Assistant:

void int_to_string( string_type& target, std::size_t value )
{
    target = std::to_string(value);
}